

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O2

string * CLI::detail::convert_arg_for_ini
                   (string *__return_storage_ptr__,string *arg,char stringQuote,char literalQuote,
                   bool disable_multi_line)

{
  byte bVar1;
  byte *pbVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  double val;
  string local_48;
  
  if (arg->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x02');
    return __return_storage_ptr__;
  }
  bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg
                            ,"true");
  if ((((bVar4) ||
       (bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)arg,"false"), bVar4)) ||
      (bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)arg,"nan"), bVar4)) ||
     (bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )arg,"inf"), bVar4)) goto LAB_00118554;
  iVar5 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2);
  if ((iVar5 != 0) &&
     (iVar5 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2), iVar5 != 0)) {
    val = 0.0;
    bVar4 = lexical_cast<double,_(CLI::detail::enabler)0>(arg,&val);
    if ((bVar4) &&
       (lVar6 = ::std::__cxx11::string::find_first_not_of((char *)arg,0x19392c), lVar6 == -1))
    goto LAB_00118554;
  }
  pbVar2 = (byte *)(arg->_M_dataplus)._M_p;
  sVar3 = arg->_M_string_length;
  if (sVar3 == 1) {
    iVar5 = isprint((uint)*pbVar2);
    if (iVar5 == 0) goto LAB_00118768;
    bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              arg,"\'");
    if (bVar4) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_88,'\x01');
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       &local_88,"\'");
      ::std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       stringQuote);
    }
    else {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_88,'\x01');
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       &local_88,arg);
      ::std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       literalQuote);
    }
  }
  else {
    if (*pbVar2 == 0x30) {
      bVar1 = pbVar2[1];
      if (bVar1 == 0x62) {
        bVar4 = ::std::
                all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>
                          (pbVar2 + 2,pbVar2 + sVar3);
      }
      else if (bVar1 == 0x6f) {
        bVar4 = ::std::
                all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>
                          (pbVar2 + 2,pbVar2 + sVar3);
      }
      else {
        if (bVar1 != 0x78) goto LAB_001186e3;
        bVar4 = ::std::
                all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>
                          (pbVar2 + 2,pbVar2 + sVar3);
      }
      if (bVar4 != false) {
LAB_00118554:
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)arg);
        return __return_storage_ptr__;
      }
    }
LAB_001186e3:
    bVar4 = is_printable(arg);
    if (!bVar4) {
LAB_00118768:
      binary_escape_string(__return_storage_ptr__,arg);
      return __return_storage_ptr__;
    }
    bVar4 = has_escapable_character(arg);
    if (bVar4) {
      if (arg->_M_string_length < 0x65 || disable_multi_line) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_88,'\x01');
        add_escaped_characters(&local_48,arg);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         &local_88,&local_48);
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         stringQuote);
        ::std::__cxx11::string::~string((string *)&val);
        this = &local_48;
        goto LAB_001187f0;
      }
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"\'\'\'",(allocator<char> *)&local_48);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       &local_88,arg);
      ::std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       "\'\'\'");
    }
    else {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_88,'\x01');
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       &local_88,arg);
      ::std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       stringQuote);
    }
  }
  this = (string *)&val;
LAB_001187f0:
  ::std::__cxx11::string::~string((string *)this);
  ::std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}